

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O2

int SUNLinSolSolve_SPGMR(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,realtype delta)

{
  uint uVar1;
  uint uVar2;
  N_Vector *v;
  realtype **h;
  realtype *q;
  N_Vector z;
  realtype *b_00;
  N_Vector y;
  N_Vector x_00;
  N_Vector y_00;
  undefined8 uVar3;
  undefined8 uVar4;
  code *pcVar5;
  code *pcVar6;
  realtype *stemp;
  N_Vector *vtemp;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  double *pdVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  realtype *new_vk_norm;
  uint *puVar20;
  realtype rVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  ulong local_118;
  double local_80;
  double local_48;
  
  if (S == (SUNLinearSolver)0x0) {
    return -0x321;
  }
  puVar20 = (uint *)S->content;
  uVar10 = *puVar20;
  uVar14 = puVar20[2];
  uVar1 = puVar20[3];
  v = *(N_Vector **)(puVar20 + 0x18);
  h = *(realtype ***)(puVar20 + 0x1a);
  q = *(realtype **)(puVar20 + 0x1c);
  z = *(N_Vector *)(puVar20 + 0x1e);
  b_00 = *(realtype **)(puVar20 + 0x20);
  y = *(N_Vector *)(puVar20 + 0x22);
  x_00 = *(N_Vector *)(puVar20 + 0x14);
  y_00 = *(N_Vector *)(puVar20 + 0x16);
  uVar3 = *(undefined8 *)(puVar20 + 0xc);
  uVar4 = *(undefined8 *)(puVar20 + 0x12);
  pcVar5 = *(code **)(puVar20 + 10);
  pcVar6 = *(code **)(puVar20 + 0x10);
  stemp = *(realtype **)(puVar20 + 0x24);
  vtemp = *(N_Vector **)(puVar20 + 0x26);
  puVar20[5] = 0;
  if (pcVar5 == (code *)0x0) {
    puVar20[4] = 0;
    uVar10 = 0xfffffcdc;
  }
  else {
    uVar2 = puVar20[1];
    uVar7 = uVar2 & 0xfffffffe;
    if (pcVar6 == (code *)0x0 && ((uVar2 & 0xfffffffd) == 1 || uVar7 == 2)) {
      puVar20[4] = 0;
      uVar10 = 0xfffffcd9;
    }
    else {
      if (puVar20[4] == 0) {
        iVar8 = (*pcVar5)(uVar3,x,y);
        if (iVar8 != 0) {
LAB_003cc9f2:
          puVar20[4] = 0;
          uVar14 = 0xfffffcdb;
          uVar10 = 0x323;
LAB_003cca03:
          if (iVar8 < 0) {
            uVar10 = uVar14;
          }
          puVar20 = (uint *)S->content;
          goto LAB_003ccfd0;
        }
        N_VLinearSum(1.0,b,-1.0,y,y);
      }
      else {
        N_VScale(1.0,b,y);
      }
      N_VScale(1.0,y,*v);
      if ((uVar2 | 2) == 3) {
        iVar8 = (*pcVar6)(delta,uVar4,*v,y);
        if (iVar8 != 0) {
          puVar20[4] = 0;
          uVar10 = 0x325;
          if (iVar8 < 0) {
            uVar10 = 0xfffffcd8;
          }
          puVar20 = (uint *)S->content;
          goto LAB_003ccfd0;
        }
      }
      else {
        N_VScale(1.0,*v,y);
      }
      if (x_00 == (N_Vector)0x0) {
        N_VScale(1.0,y,*v);
      }
      else {
        N_VProd(x_00,y,*v);
      }
      rVar21 = N_VDotProd(*v,*v);
      dVar23 = 0.0;
      if (0.0 < rVar21) {
        rVar21 = N_VDotProd(*v,*v);
        if (rVar21 < 0.0) {
          dVar23 = sqrt(rVar21);
        }
        else {
          dVar23 = SQRT(rVar21);
        }
      }
      *(double *)(puVar20 + 6) = dVar23;
      if (dVar23 <= delta) {
        puVar20[4] = 0;
        puVar20 = (uint *)S->content;
LAB_003ccfce:
        uVar10 = 0;
      }
      else {
        N_VConst(0.0,z);
        local_118 = 0;
        uVar11 = 0;
        if (0 < (int)uVar10) {
          uVar11 = (ulong)uVar10;
        }
        uVar17 = 0;
        dVar24 = dVar23;
        local_48 = dVar23;
        do {
          lVar18 = 4;
          if ((int)uVar1 < (int)uVar17) {
LAB_003cd099:
            if (dVar23 <= local_48) {
              puVar20[4] = 0;
              puVar20 = (uint *)S->content;
              uVar10 = 0x322;
              goto LAB_003ccfd0;
            }
            if (y_00 != (N_Vector)0x0) {
              N_VDiv(z,y_00,z);
            }
            if (uVar7 == 2) {
              iVar8 = (*pcVar6)(delta,uVar4,z,y,2);
              if (iVar8 != 0) {
LAB_003cd0ea:
                puVar20[4] = 0;
                uVar10 = 0x325;
                if (iVar8 < 0) {
                  uVar10 = 0xfffffcd8;
                }
                puVar20 = (uint *)S->content;
                goto LAB_003ccfd0;
              }
            }
            else {
              N_VScale(1.0,z,y);
            }
            if (puVar20[4] == 0) {
              N_VLinearSum(1.0,x,1.0,y,x);
            }
            else {
              N_VScale(1.0,y,x);
            }
            puVar20[4] = 0;
            puVar20 = (uint *)S->content;
            uVar10 = 0x321;
            goto LAB_003ccfd0;
          }
          for (lVar12 = 0; lVar12 <= (int)uVar10; lVar12 = lVar12 + 1) {
            for (uVar15 = 0; uVar10 != uVar15; uVar15 = uVar15 + 1) {
              h[lVar12][uVar15] = 0.0;
            }
          }
          local_80 = 1.0;
          uVar15 = 0;
          rVar21 = dVar24;
          while (N_VScale(1.0 / rVar21,v[uVar15],v[uVar15]), uVar11 != uVar15) {
            puVar20[5] = puVar20[5] + 1;
            if (y_00 == (N_Vector)0x0) {
              N_VScale(1.0,v[uVar15],y);
            }
            else {
              N_VDiv(v[uVar15],y_00,y);
            }
            if (uVar7 == 2) {
              N_VScale(1.0,y,v[uVar15 + 1]);
              iVar8 = (*pcVar6)(delta,uVar4,v[uVar15 + 1],y,2);
              if (iVar8 == 0) goto LAB_003ccc55;
LAB_003ccfe6:
              puVar20[4] = 0;
              uVar14 = 0xfffffcd8;
              uVar10 = 0x325;
              goto LAB_003cca03;
            }
LAB_003ccc55:
            iVar8 = (*pcVar5)(uVar3,y,v[uVar15 + 1]);
            if (iVar8 != 0) goto LAB_003cc9f2;
            if ((uVar2 | 2) == 3) {
              iVar8 = (*pcVar6)(delta,uVar4,v[uVar15 + 1],y,1);
              if (iVar8 != 0) goto LAB_003ccfe6;
            }
            else {
              N_VScale(1.0,v[uVar15 + 1],y);
            }
            if (x_00 == (N_Vector)0x0) {
              N_VScale(1.0,y,v[uVar15 + 1]);
            }
            else {
              N_VProd(x_00,y,v[uVar15 + 1]);
            }
            local_118 = uVar15 + 1;
            new_vk_norm = (realtype *)((long)h[uVar15 + 1] + lVar18 + -4);
            iVar8 = (int)local_118;
            if (uVar14 == 2) {
              iVar9 = SUNClassicalGS(v,h,iVar8,uVar10,new_vk_norm,stemp,vtemp);
            }
            else {
              iVar9 = SUNModifiedGS(v,h,iVar8,uVar10,new_vk_norm);
            }
            if (iVar9 != 0) {
              puVar20[4] = 0;
              puVar20 = (uint *)S->content;
              uVar10 = 0xfffffcd6;
              goto LAB_003ccfd0;
            }
            iVar8 = SUNQRfact(iVar8,h,q,(int)uVar15);
            if (iVar8 != 0) {
              puVar20[4] = 0;
              puVar20 = (uint *)S->content;
              uVar10 = 0x327;
              goto LAB_003ccfd0;
            }
            local_80 = local_80 * *(double *)((long)q + lVar18 * 2);
            local_48 = ABS(dVar24 * local_80);
            *(double *)(puVar20 + 6) = local_48;
            if (local_48 <= delta) {
              local_118 = (ulong)((int)uVar15 + 1);
              break;
            }
            rVar21 = h[uVar15 + 1][uVar15];
            lVar18 = lVar18 + 8;
            uVar15 = local_118;
          }
          *b_00 = dVar24;
          iVar8 = (int)local_118;
          uVar19 = 0;
          if (0 < iVar8) {
            uVar19 = local_118 & 0xffffffff;
          }
          for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
            b_00[uVar13 + 1] = 0.0;
          }
          iVar9 = SUNQRsol(iVar8,h,q,b_00);
          if (iVar9 != 0) {
            puVar20[4] = 0;
            puVar20 = (uint *)S->content;
            uVar10 = 0xfffffcd5;
            goto LAB_003ccfd0;
          }
          *stemp = 1.0;
          *vtemp = z;
          for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
            stemp[uVar13 + 1] = b_00[uVar13];
            vtemp[uVar13 + 1] = v[uVar13];
          }
          iVar9 = N_VLinearCombination(iVar8 + 1,stemp,vtemp,z);
          if (iVar9 != 0) break;
          if ((long)uVar15 < (long)(int)uVar10) {
            if (y_00 != (N_Vector)0x0) {
              N_VDiv(z,y_00,z);
            }
            if (uVar7 == 2) {
              iVar8 = (*pcVar6)(delta,uVar4,z,y,2);
              if (iVar8 != 0) goto LAB_003cd0ea;
            }
            else {
              N_VScale(1.0,z,y);
            }
            if (puVar20[4] == 0) {
              N_VLinearSum(1.0,x,1.0,y,x);
            }
            else {
              N_VScale(1.0,y,x);
            }
            puVar20[4] = 0;
            puVar20 = (uint *)S->content;
            goto LAB_003ccfce;
          }
          if (uVar17 == uVar1) goto LAB_003cd099;
          uVar15 = local_118 & 0xffffffff;
          pdVar16 = q + uVar15 * 2 + -1;
          dVar22 = 1.0;
          for (; 0 < (int)uVar15; uVar15 = uVar15 - 1) {
            b_00[uVar15] = pdVar16[-1] * dVar22;
            dVar22 = dVar22 * *pdVar16;
            pdVar16 = pdVar16 + -2;
          }
          *b_00 = dVar22;
          for (lVar18 = 0; lVar18 <= iVar8; lVar18 = lVar18 + 1) {
            b_00[lVar18] = b_00[lVar18] * dVar24 * dVar22;
          }
          for (lVar18 = 0; lVar18 <= iVar8; lVar18 = lVar18 + 1) {
            stemp[lVar18] = b_00[lVar18];
            vtemp[lVar18] = v[lVar18];
          }
          dVar24 = ABS(dVar24 * dVar22);
          iVar8 = N_VLinearCombination(iVar8 + 1,stemp,vtemp,*v);
          uVar17 = uVar17 + 1;
        } while (iVar8 == 0);
        puVar20[4] = 0;
        puVar20 = (uint *)S->content;
        uVar10 = 0xfffffcd4;
      }
    }
  }
LAB_003ccfd0:
  puVar20[8] = uVar10;
  return uVar10;
}

Assistant:

int SUNLinSolSolve_SPGMR(SUNLinearSolver S, SUNMatrix A, N_Vector x,
                         N_Vector b, realtype delta)
{
  /* local data and shortcut variables */
  N_Vector *V, xcor, vtemp, s1, s2;
  realtype **Hes, *givens, *yg, *res_norm;
  realtype beta, rotation_product, r_norm, s_product, rho;
  booleantype preOnLeft, preOnRight, scale2, scale1, converged;
  booleantype *zeroguess;
  int i, j, k, l, l_plus_1, l_max, krydim, ier, ntries, max_restarts, gstype;
  int *nli;
  void *A_data, *P_data;
  SUNATimesFn atimes;
  SUNPSolveFn psolve;

  /* local shortcuts for fused vector operations */
  realtype* cv;
  N_Vector* Xv;

  /* Initialize some variables */
  l_plus_1 = 0;
  krydim = 0;

  /* Make local shorcuts to solver variables. */
  if (S == NULL) return(SUNLS_MEM_NULL);
  l_max        = SPGMR_CONTENT(S)->maxl;
  max_restarts = SPGMR_CONTENT(S)->max_restarts;
  gstype       = SPGMR_CONTENT(S)->gstype;
  V            = SPGMR_CONTENT(S)->V;
  Hes          = SPGMR_CONTENT(S)->Hes;
  givens       = SPGMR_CONTENT(S)->givens;
  xcor         = SPGMR_CONTENT(S)->xcor;
  yg           = SPGMR_CONTENT(S)->yg;
  vtemp        = SPGMR_CONTENT(S)->vtemp;
  s1           = SPGMR_CONTENT(S)->s1;
  s2           = SPGMR_CONTENT(S)->s2;
  A_data       = SPGMR_CONTENT(S)->ATData;
  P_data       = SPGMR_CONTENT(S)->PData;
  atimes       = SPGMR_CONTENT(S)->ATimes;
  psolve       = SPGMR_CONTENT(S)->Psolve;
  zeroguess    = &(SPGMR_CONTENT(S)->zeroguess);
  nli          = &(SPGMR_CONTENT(S)->numiters);
  res_norm     = &(SPGMR_CONTENT(S)->resnorm);
  cv           = SPGMR_CONTENT(S)->cv;
  Xv           = SPGMR_CONTENT(S)->Xv;

  /* Initialize counters and convergence flag */
  *nli = 0;
  converged = SUNFALSE;

  /* Set booleantype flags for internal solver options */
  preOnLeft  = ( (SPGMR_CONTENT(S)->pretype == SUN_PREC_LEFT) ||
                 (SPGMR_CONTENT(S)->pretype == SUN_PREC_BOTH) );
  preOnRight = ( (SPGMR_CONTENT(S)->pretype == SUN_PREC_RIGHT) ||
                 (SPGMR_CONTENT(S)->pretype == SUN_PREC_BOTH) );
  scale1 = (s1 != NULL);
  scale2 = (s2 != NULL);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  if (SPGMR_CONTENT(S)->print_level && SPGMR_CONTENT(S)->info_file
      && (SPGMR_CONTENT(S)->info_file != S->sunctx->logger->info_fp))
    fprintf(SPGMR_CONTENT(S)->info_file, "SUNLINSOL_SPGMR:\n");
#endif

  /* Check if Atimes function has been set */
  if (atimes == NULL) {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_ATIMES_NULL;
    return(LASTFLAG(S));
  }

  /* If preconditioning, check if psolve has been set */
  if ((preOnLeft || preOnRight) && psolve == NULL) {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_PSOLVE_NULL;
    return(LASTFLAG(S));
  }

  /* Set vtemp and V[0] to initial (unscaled) residual r_0 = b - A*x_0 */
  if (*zeroguess) {
    N_VScale(ONE, b, vtemp);
  } else {
    ier = atimes(A_data, x, vtemp);
    if (ier != 0) {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (ier < 0) ?
        SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
      return(LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, vtemp, vtemp);
  }
  N_VScale(ONE, vtemp, V[0]);

  /* Apply left preconditioner and left scaling to V[0] = r_0 */
  if (preOnLeft) {
    ier = psolve(P_data, V[0], vtemp, delta, SUN_PREC_LEFT);
    if (ier != 0) {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (ier < 0) ?
        SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
      return(LASTFLAG(S));
    }
  } else {
    N_VScale(ONE, V[0], vtemp);
  }

  if (scale1) {
    N_VProd(s1, vtemp, V[0]);
  } else {
    N_VScale(ONE, vtemp, V[0]);
  }

  /* Set r_norm = beta to L2 norm of V[0] = s1 P1_inv r_0, and
     return if small  */
  *res_norm = r_norm = beta = SUNRsqrt(N_VDotProd(V[0], V[0]));

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  /* print initial residual */
  if (SPGMR_CONTENT(S)->print_level && SPGMR_CONTENT(S)->info_file
      && (SPGMR_CONTENT(S)->info_file != S->sunctx->logger->info_fp))
  {
    fprintf(SPGMR_CONTENT(S)->info_file,
            SUNLS_MSG_RESIDUAL,
            (long int) 0, *res_norm);
  }
  SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
    "SUNLinSolSolve_SPGMR", "initial-residual",
    "nli = %li, resnorm = %.16g", (long int) 0, *res_norm);
#endif

  if (r_norm <= delta) {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_SUCCESS;
    return(LASTFLAG(S));
  }

  /* Initialize rho to avoid compiler warning message */
  rho = beta;

  /* Set xcor = 0 */
  N_VConst(ZERO, xcor);

  /* Begin outer iterations: up to (max_restarts + 1) attempts */
  for (ntries=0; ntries<=max_restarts; ntries++) {

    /* Initialize the Hessenberg matrix Hes and Givens rotation
       product.  Normalize the initial vector V[0] */
    for (i=0; i<=l_max; i++)
      for (j=0; j<l_max; j++)
        Hes[i][j] = ZERO;

    rotation_product = ONE;
    N_VScale(ONE/r_norm, V[0], V[0]);

    /* Inner loop: generate Krylov sequence and Arnoldi basis */
    for (l=0; l<l_max; l++) {
      (*nli)++;
      krydim = l_plus_1 = l + 1;

      /* Generate A-tilde V[l], where A-tilde = s1 P1_inv A P2_inv s2_inv */

      /*   Apply right scaling: vtemp = s2_inv V[l] */
      if (scale2) N_VDiv(V[l], s2, vtemp);
      else N_VScale(ONE, V[l], vtemp);

      /*   Apply right preconditioner: vtemp = P2_inv s2_inv V[l] */
      if (preOnRight) {
        N_VScale(ONE, vtemp, V[l_plus_1]);
        ier = psolve(P_data, V[l_plus_1], vtemp, delta, SUN_PREC_RIGHT);
        if (ier != 0) {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (ier < 0) ?
            SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
          return(LASTFLAG(S));
        }
      }

      /* Apply A: V[l+1] = A P2_inv s2_inv V[l] */
      ier = atimes( A_data, vtemp, V[l_plus_1] );
      if (ier != 0) {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
        return(LASTFLAG(S));
      }

      /* Apply left preconditioning: vtemp = P1_inv A P2_inv s2_inv V[l] */
      if (preOnLeft) {
        ier = psolve(P_data, V[l_plus_1], vtemp, delta, SUN_PREC_LEFT);
        if (ier != 0) {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (ier < 0) ?
            SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
          return(LASTFLAG(S));
        }
      } else {
        N_VScale(ONE, V[l_plus_1], vtemp);
      }

      /* Apply left scaling: V[l+1] = s1 P1_inv A P2_inv s2_inv V[l] */
      if (scale1) {
        N_VProd(s1, vtemp, V[l_plus_1]);
      } else {
        N_VScale(ONE, vtemp, V[l_plus_1]);
      }

      /*  Orthogonalize V[l+1] against previous V[i]: V[l+1] = w_tilde */
      if (gstype == SUN_CLASSICAL_GS) {
        if (SUNClassicalGS(V, Hes, l_plus_1, l_max, &(Hes[l_plus_1][l]),
                           cv, Xv) != 0) {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = SUNLS_GS_FAIL;
          return(LASTFLAG(S));
        }
      } else {
        if (SUNModifiedGS(V, Hes, l_plus_1, l_max, &(Hes[l_plus_1][l])) != 0) {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = SUNLS_GS_FAIL;
          return(LASTFLAG(S));
        }
      }

      /*  Update the QR factorization of Hes */
      if(SUNQRfact(krydim, Hes, givens, l) != 0 ) {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = SUNLS_QRFACT_FAIL;
        return(LASTFLAG(S));
      }

      /*  Update residual norm estimate; break if convergence test passes */
      rotation_product *= givens[2*l+1];
      *res_norm = rho = SUNRabs(rotation_product*r_norm);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
      /* print current iteration number and the residual */
      if (SPGMR_CONTENT(S)->print_level && SPGMR_CONTENT(S)->info_file
          && (SPGMR_CONTENT(S)->info_file != S->sunctx->logger->info_fp))
      {
        fprintf(SPGMR_CONTENT(S)->info_file,
                SUNLS_MSG_RESIDUAL,
                (long int) *nli, *res_norm);
      }
      SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
        "SUNLinSolSolve_SPGMR", "iterate-residual",
        "nli = %li, resnorm = %.16g", (long int) *nli, *res_norm);
#endif

      if (rho <= delta) { converged = SUNTRUE; break; }

      /* Normalize V[l+1] with norm value from the Gram-Schmidt routine */
      N_VScale(ONE/Hes[l_plus_1][l], V[l_plus_1], V[l_plus_1]);
    }

    /* Inner loop is done.  Compute the new correction vector xcor */

    /*   Construct g, then solve for y */
    yg[0] = r_norm;
    for (i=1; i<=krydim; i++) yg[i]=ZERO;
    if (SUNQRsol(krydim, Hes, givens, yg) != 0) {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUNLS_QRSOL_FAIL;
      return(LASTFLAG(S));
    }

    /*   Add correction vector V_l y to xcor */
    cv[0] = ONE;
    Xv[0] = xcor;

    for (k=0; k<krydim; k++) {
      cv[k+1] = yg[k];
      Xv[k+1] = V[k];
    }
    ier = N_VLinearCombination(krydim+1, cv, Xv, xcor);
    if (ier != SUNLS_SUCCESS) {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUNLS_VECTOROP_ERR;
      return(SUNLS_VECTOROP_ERR);
    }

    /* If converged, construct the final solution vector x and return */
    if (converged) {

      /* Apply right scaling and right precond.: vtemp = P2_inv s2_inv xcor */
      if (scale2) N_VDiv(xcor, s2, xcor);
      if (preOnRight) {
        ier = psolve(P_data, xcor, vtemp, delta, SUN_PREC_RIGHT);
        if (ier != 0) {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (ier < 0) ?
            SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
          return(LASTFLAG(S));
        }
      } else {
        N_VScale(ONE, xcor, vtemp);
      }

      /* Add vtemp to initial x to get final solution x, and return */
      if (*zeroguess)
        N_VScale(ONE, vtemp, x);
      else
        N_VLinearSum(ONE, x, ONE, vtemp, x);

      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUNLS_SUCCESS;
      return(LASTFLAG(S));
    }

    /* Not yet converged; if allowed, prepare for restart */
    if (ntries == max_restarts) break;

    /* Construct last column of Q in yg */
    s_product = ONE;
    for (i=krydim; i>0; i--) {
      yg[i] = s_product*givens[2*i-2];
      s_product *= givens[2*i-1];
    }
    yg[0] = s_product;

    /* Scale r_norm and yg */
    r_norm *= s_product;
    for (i=0; i<=krydim; i++)
      yg[i] *= r_norm;
    r_norm = SUNRabs(r_norm);

    /* Multiply yg by V_(krydim+1) to get last residual vector; restart */
    for (k=0; k<=krydim; k++) {
      cv[k] = yg[k];
      Xv[k] = V[k];
    }
    ier = N_VLinearCombination(krydim+1, cv, Xv, V[0]);
    if (ier != SUNLS_SUCCESS) {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUNLS_VECTOROP_ERR;
      return(SUNLS_VECTOROP_ERR);
    }

  }

  /* Failed to converge, even after allowed restarts.
     If the residual norm was reduced below its initial value, compute
     and return x anyway.  Otherwise return failure flag. */
  if (rho < beta) {

    /* Apply right scaling and right precond.: vtemp = P2_inv s2_inv xcor */
    if (scale2) N_VDiv(xcor, s2, xcor);
    if (preOnRight) {
      ier = psolve(P_data, xcor, vtemp, delta, SUN_PREC_RIGHT);
      if (ier != 0) {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
        return(LASTFLAG(S));
      }
    } else {
      N_VScale(ONE, xcor, vtemp);
    }

    /* Add vtemp to initial x to get final solution x, and return */
    if (*zeroguess)
      N_VScale(ONE, vtemp, x);
    else
      N_VLinearSum(ONE, x, ONE, vtemp, x);

    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_RES_REDUCED;
    return(LASTFLAG(S));
  }

  *zeroguess  = SUNFALSE;
  LASTFLAG(S) = SUNLS_CONV_FAIL;
  return(LASTFLAG(S));
}